

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

char * Ndr_ObjWriteConstant(uint *pBits,int nBits)

{
  size_t sVar1;
  long lVar2;
  byte *pbVar3;
  
  if (nBits < 0x2706) {
    sprintf(Ndr_ObjWriteConstant::Buffer,"%d\'b",(ulong)(uint)nBits);
    sVar1 = strlen(Ndr_ObjWriteConstant::Buffer);
    lVar2 = sVar1 << 0x20;
    pbVar3 = (byte *)(Ndr_ObjWriteConstant::Buffer + (int)sVar1);
    while (0 < nBits) {
      nBits = nBits - 1;
      *pbVar3 = (pBits[(uint)nBits >> 5] >> (nBits & 0x1fU) & 1) != 0 | 0x30;
      lVar2 = lVar2 + 0x100000000;
      pbVar3 = pbVar3 + 1;
    }
    Ndr_ObjWriteConstant::Buffer[lVar2 >> 0x20] = '\0';
    return Ndr_ObjWriteConstant::Buffer;
  }
  __assert_fail("nBits + 10 < 10000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                ,0xb6,"char *Ndr_ObjWriteConstant(unsigned int *, int)");
}

Assistant:

char * Ndr_ObjWriteConstant( unsigned * pBits, int nBits )
{
    static char Buffer[10000]; int i, Len;
    assert( nBits + 10 < 10000 );
    sprintf( Buffer, "%d\'b", nBits );
    Len = strlen(Buffer);
    for ( i = nBits-1; i >= 0; i-- )
        Buffer[Len++] = '0' + Abc_InfoHasBit(pBits, i);
    Buffer[Len] = 0;
    return Buffer;
}